

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

void __thiscall perfetto::protos::pbzero::EventCategory::set_iid(EventCategory *this,uint64_t value)

{
  uint64_t value_local;
  EventCategory *this_local;
  
  protozero::internal::FieldWriter<(protozero::proto_utils::ProtoSchemaType)4>::Append
            (&this->super_Message,1,value);
  return;
}

Assistant:

void set_iid(uint64_t value) {
    static constexpr uint32_t field_id = FieldMetadata_Iid::kFieldId;
    // Call the appropriate protozero::Message::Append(field_id, ...)
    // method based on the type of the field.
    ::protozero::internal::FieldWriter<
      ::protozero::proto_utils::ProtoSchemaType::kUint64>
        ::Append(*this, field_id, value);
  }